

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O1

UnicodeSet * icu_63::unisets::get(Key key)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  Key extraout_EDX;
  Key extraout_EDX_00;
  Key KVar3;
  Key k3;
  code *pattern;
  char *size;
  UnicodeString *pUVar4;
  long lVar5;
  UErrorCode localStatus;
  ParseDataSink sink;
  LocalUResourceBundlePointer rb;
  UErrorCode local_22c;
  ResourceSink local_228;
  LocalPointerBase<UResourceBundle> local_220;
  UnicodeString local_218;
  UnicodeString local_1d8;
  UnicodeString local_198;
  UnicodeString local_158;
  UnicodeString local_118;
  UnicodeString local_d8;
  UnicodeString local_98;
  UnicodeString local_58;
  
  local_22c = U_ZERO_ERROR;
  if (::(anonymous_namespace)::gNumberParseUniSetsInitOnce != 2) {
    UVar1 = umtx_initImplPreInit((UInitOnce *)&::(anonymous_namespace)::gNumberParseUniSetsInitOnce)
    ;
    if (UVar1 != '\0') {
      pattern = anon_unknown.dwarf_29e150::cleanupNumberParseUniSets;
      ucln_common_registerCleanup_63
                (UCLN_COMMON_NUMPARSE_UNISETS,anon_unknown.dwarf_29e150::cleanupNumberParseUniSets);
      UnicodeSet::UnicodeSet((UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet);
      UnicodeSet::freeze((UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet);
      ::(anonymous_namespace)::gEmptyUnicodeSetInitialized = 1;
      pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
      if (pUVar2 == (UnicodeSet *)0x0) {
        DAT_003ff328 = (UnicodeSet *)0x0;
      }
      else {
        UnicodeString::UnicodeString
                  (&local_58,L"[[:Zs:][\\u0009][:Bidi_Control:][:Variation_Selector:]]");
        pattern = (code *)&local_58;
        UnicodeSet::UnicodeSet(pUVar2,(UnicodeString *)pattern,&local_22c);
        DAT_003ff328 = pUVar2;
        UnicodeString::~UnicodeString(&local_58);
      }
      pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
      if (pUVar2 == (UnicodeSet *)0x0) {
        _DAT_003ff330 = (UnicodeSet *)0x0;
      }
      else {
        UnicodeString::UnicodeString(&local_98,L"[[:Bidi_Control:]]");
        UnicodeSet::UnicodeSet(pUVar2,&local_98,&local_22c);
        _DAT_003ff330 = pUVar2;
        UnicodeString::~UnicodeString(&local_98);
      }
      local_220.ptr = ures_open_63((char *)0x0,"root",&local_22c);
      if (local_22c < U_ILLEGAL_ARGUMENT_ERROR) {
        local_228.super_UObject._vptr_UObject = (UObject)&PTR__ResourceSink_003ee1a0;
        size = "parse";
        ures_getAllItemsWithFallback_63(local_220.ptr,"parse",&local_228,&local_22c);
        if (local_22c < U_ILLEGAL_ARGUMENT_ERROR) {
          pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)size);
          if (pUVar2 == (UnicodeSet *)0x0) {
            DAT_003ff358 = (UnicodeSet *)0x0;
            KVar3 = extraout_EDX;
          }
          else {
            UnicodeString::UnicodeString
                      (&local_d8,
                       L"[\'٬‘’＇\\u0020\\u00A0\\u2000-\\u200A\\u202F\\u205F\\u3000]");
            UnicodeSet::UnicodeSet(pUVar2,&local_d8,&local_22c);
            DAT_003ff358 = pUVar2;
            UnicodeString::~UnicodeString(&local_d8);
            KVar3 = extraout_EDX_00;
          }
          _DAT_003ff360 = anon_unknown.dwarf_29e150::computeUnion(COMMA,PERIOD,KVar3);
          pUVar4 = (UnicodeString *)0x6;
          _DAT_003ff368 = anon_unknown.dwarf_29e150::computeUnion(STRICT_COMMA,STRICT_PERIOD,k3);
          pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
          if (pUVar2 == (UnicodeSet *)0x0) {
            _DAT_003ff380 = (UnicodeSet *)0x0;
          }
          else {
            UnicodeString::UnicodeString(&local_118,L"[%٪]");
            pUVar4 = &local_118;
            UnicodeSet::UnicodeSet(pUVar2,pUVar4,&local_22c);
            _DAT_003ff380 = pUVar2;
            UnicodeString::~UnicodeString(&local_118);
          }
          pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
          if (pUVar2 == (UnicodeSet *)0x0) {
            _DAT_003ff388 = (UnicodeSet *)0x0;
          }
          else {
            UnicodeString::UnicodeString(&local_158,L"[‰؉]");
            pUVar4 = &local_158;
            UnicodeSet::UnicodeSet(pUVar2,pUVar4,&local_22c);
            _DAT_003ff388 = pUVar2;
            UnicodeString::~UnicodeString(&local_158);
          }
          pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
          if (pUVar2 == (UnicodeSet *)0x0) {
            _DAT_003ff390 = (UnicodeSet *)0x0;
          }
          else {
            UnicodeString::UnicodeString(&local_198,L"[∞]");
            pUVar4 = &local_198;
            UnicodeSet::UnicodeSet(pUVar2,pUVar4,&local_22c);
            _DAT_003ff390 = pUVar2;
            UnicodeString::~UnicodeString(&local_198);
          }
          pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
          if (pUVar2 == (UnicodeSet *)0x0) {
            _DAT_003ff3b0 = (UnicodeSet *)0x0;
          }
          else {
            UnicodeString::UnicodeString(&local_1d8,L"[¥\\uffe5]");
            pUVar4 = &local_1d8;
            UnicodeSet::UnicodeSet(pUVar2,pUVar4,&local_22c);
            _DAT_003ff3b0 = pUVar2;
            UnicodeString::~UnicodeString(&local_1d8);
          }
          pUVar2 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
          KVar3 = (Key)pUVar4;
          if (pUVar2 == (UnicodeSet *)0x0) {
            DAT_003ff3b8 = (UnicodeSet *)0x0;
          }
          else {
            UnicodeString::UnicodeString(&local_218,L"[:digit:]");
            pUVar4 = &local_218;
            UnicodeSet::UnicodeSet(pUVar2,pUVar4,&local_22c);
            KVar3 = (Key)pUVar4;
            DAT_003ff3b8 = pUVar2;
            UnicodeString::~UnicodeString(&local_218);
          }
          _DAT_003ff3c0 = anon_unknown.dwarf_29e150::computeUnion(ALL_SEPARATORS,KVar3);
          _DAT_003ff3c8 = anon_unknown.dwarf_29e150::computeUnion(STRICT_ALL_SEPARATORS,KVar3);
          lVar5 = 0;
          do {
            if (*(UnicodeSet **)((long)&::(anonymous_namespace)::gUnicodeSets + lVar5) !=
                (UnicodeSet *)0x0) {
              UnicodeSet::freeze(*(UnicodeSet **)
                                  ((long)&::(anonymous_namespace)::gUnicodeSets + lVar5));
            }
            lVar5 = lVar5 + 8;
          } while (lVar5 != 0xb0);
        }
        ResourceSink::~ResourceSink(&local_228);
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&local_220);
      DAT_003ff30c = local_22c;
      umtx_initImplPostInit((UInitOnce *)&::(anonymous_namespace)::gNumberParseUniSetsInitOnce);
      goto LAB_002b44e2;
    }
  }
  if (U_ZERO_ERROR < DAT_003ff30c) {
    local_22c = DAT_003ff30c;
  }
LAB_002b44e2:
  if (local_22c < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar2 = (UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet;
    if ((UnicodeSet *)(&::(anonymous_namespace)::gUnicodeSets)[key] != (UnicodeSet *)0x0) {
      pUVar2 = (UnicodeSet *)(&::(anonymous_namespace)::gUnicodeSets)[key];
    }
  }
  else {
    pUVar2 = (UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet;
  }
  return pUVar2;
}

Assistant:

const UnicodeSet* unisets::get(Key key) {
    UErrorCode localStatus = U_ZERO_ERROR;
    umtx_initOnce(gNumberParseUniSetsInitOnce, &initNumberParseUniSets, localStatus);
    if (U_FAILURE(localStatus)) {
        return reinterpret_cast<UnicodeSet*>(gEmptyUnicodeSet);
    }
    return getImpl(key);
}